

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_indexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  BOOL BVar2;
  JSValueUnion ctx_00;
  JSValueUnion JVar3;
  int64_t iVar4;
  ulong idx;
  JSValue *countp;
  ulong uVar5;
  int64_t *piVar6;
  bool bVar7;
  JSValue v;
  JSValue obj;
  JSValue v_00;
  JSValue JVar8;
  JSValue JVar9;
  JSValue op2;
  uint32_t count;
  JSValueUnion local_68;
  long local_60;
  ulong local_58;
  JSValue *arrp;
  int64_t len;
  JSValue val;
  
  countp = argv;
  JVar8 = JS_ToObject(ctx,this_val);
  JVar3 = (JSValueUnion)JVar8.tag;
  ctx_00 = JVar8.u;
  iVar1 = js_get_length64(ctx,&len,JVar8);
  if (iVar1 == 0) {
    local_60 = len;
    uVar5 = 0xffffffffffffffff;
    if (0 < len) {
      local_58 = 0;
      if (1 < argc) {
        countp = (JSValue *)0x0;
        iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_58,argv[1],0,len,len);
        if (iVar1 != 0) goto LAB_00154865;
      }
      idx = local_58;
      JVar8.tag = (int64_t)&arrp;
      JVar8.u.ptr = JVar3.ptr;
      BVar2 = js_get_fast_array((JSContext *)ctx_00.ptr,JVar8,(JSValue **)&count,(uint32_t *)countp)
      ;
      if (BVar2 != 0) {
        piVar6 = &arrp[idx].tag;
        local_68 = JVar3;
        for (; JVar3 = local_68, (long)idx < (long)(ulong)count; idx = idx + 1) {
          JVar8 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          JVar3 = (JSValueUnion)((JSValueUnion *)(piVar6 + -1))->ptr;
          iVar4 = *piVar6;
          if (0xfffffff4 < (uint)iVar4) {
            *(int *)JVar3.ptr = *JVar3.ptr + 1;
          }
          op2.tag = iVar4;
          op2.u.ptr = JVar3.ptr;
          BVar2 = js_strict_eq2(ctx,JVar8,op2,JS_EQ_STRICT);
          uVar5 = idx;
          JVar3 = local_68;
          if (BVar2 != 0) goto LAB_001549ad;
          piVar6 = piVar6 + 2;
        }
      }
      for (; uVar5 = 0xffffffffffffffff, (long)idx < local_60; idx = idx + 1) {
        obj.tag = (int64_t)JVar3.ptr;
        obj.u.ptr = ctx_00.ptr;
        iVar1 = JS_TryGetPropertyInt64(ctx,obj,idx,&val);
        if (iVar1 < 0) goto LAB_00154865;
        if (iVar1 != 0) {
          JVar8 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          BVar2 = js_strict_eq2(ctx,JVar8,val,JS_EQ_STRICT);
          uVar5 = idx;
          if (BVar2 != 0) break;
        }
      }
    }
LAB_001549ad:
    v_00.tag = (int64_t)JVar3.ptr;
    v_00.u.ptr = ctx_00.ptr;
    JS_FreeValue(ctx,v_00);
    bVar7 = (long)(int)uVar5 == uVar5;
    JVar3.float64 = (double)(long)uVar5;
    if (bVar7) {
      JVar3.ptr = (void *)(uVar5 & 0xffffffff);
    }
    iVar4 = 7;
    if (bVar7) {
      iVar4 = 0;
    }
  }
  else {
LAB_00154865:
    v.tag = (int64_t)JVar3.ptr;
    v.u.ptr = ctx_00.ptr;
    JS_FreeValue(ctx,v);
    iVar4 = 6;
    JVar3.float64 = 0.0;
  }
  JVar9.tag = iVar4;
  JVar9.u.float64 = JVar3.float64;
  return JVar9;
}

Assistant:

static JSValue js_array_indexOf(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = -1;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]), JS_EQ_STRICT)) {
                    res = n;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            int present = JS_TryGetPropertyInt64(ctx, obj, n, &val);
            if (present < 0)
                goto exception;
            if (present) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val, JS_EQ_STRICT)) {
                    res = n;
                    break;
                }
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewInt64(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}